

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O0

void __thiscall ki::dml::Record::Record(Record *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  local_58;
  vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_> local_28;
  Record *local_10;
  Record *this_local;
  
  local_10 = this;
  util::Serializable::Serializable(&this->super_Serializable);
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_write_to_00258958;
  std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::vector(&this->m_fields);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  ::map(&this->m_field_map);
  memset(&local_28,0,0x18);
  std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::vector(&local_28);
  std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::operator=
            (&this->m_fields,&local_28);
  std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::~vector(&local_28);
  memset(&local_58,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  ::map(&local_58);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  ::operator=(&this->m_field_map,&local_58);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  ::~map(&local_58);
  return;
}

Assistant:

Record::Record()
	{
		m_fields = FieldList();
		m_field_map = FieldNameMap();
	}